

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf2.c
# Opt level: O0

bool_t gf2IsOperable(qr_o *f)

{
  ulong *puVar1;
  bool_t bVar2;
  long lVar3;
  long in_RDI;
  size_t n1;
  size_t *p;
  qr_o *in_stack_ffffffffffffffe0;
  
  bVar2 = qrIsOperable(in_stack_ffffffffffffffe0);
  if ((bVar2 == 0) || (bVar2 = memIsValid(*(void **)(in_RDI + 0x28),0x20), bVar2 == 0)) {
    return 0;
  }
  puVar1 = *(ulong **)(in_RDI + 0x28);
  if ((((puVar1[1] < *puVar1) && ((puVar1[2] <= puVar1[1] && (puVar1[3] <= puVar1[2])))) &&
      ((puVar1[2] == 0 ||
       (((puVar1[1] != puVar1[2] && (puVar1[2] != puVar1[3])) && (puVar1[3] != 0)))))) &&
     ((*(ulong *)(in_RDI + 0x30) == *puVar1 + 0x3f >> 6 &&
      (*(ulong *)(in_RDI + 0x38) == *puVar1 + 7 >> 3)))) {
    lVar3 = *(long *)(in_RDI + 0x30) + (long)(int)(uint)((*puVar1 & 0x3f) == 0);
    bVar2 = memIsValid(*(void **)(in_RDI + 0x18),lVar3 * 8);
    if ((bVar2 != 0) && (*(long *)(*(long *)(in_RDI + 0x18) + (lVar3 + -1) * 8) != 0)) {
      return 1;
    }
    return 0;
  }
  return 0;
}

Assistant:

bool_t gf2IsOperable(const qr_o* f)
{
	const size_t* p;
	size_t n1;
	if (!qrIsOperable(f) || 
		!memIsValid(f->params, 4 * sizeof(size_t)))
		return FALSE;
	// проверить описание многочлена
	p = (size_t*)f->params;
	if (p[0] <= p[1] || p[1] < p[2] || p[2] < p[3] ||
		(p[2] > 0 && (p[1] == p[2] || p[2] == p[3] || p[3] == 0)) ||
		f->n != W_OF_B(p[0]) || f->no != O_OF_B(p[0]))
		return FALSE;
	// проверить модуль
	n1 = f->n + (p[0] % B_PER_W == 0);
	if (!wwIsValid(f->mod, n1) || f->mod[n1 - 1] == 0)
		return FALSE;
	// все нормально
	return TRUE;
}